

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_fekete_rule.cpp
# Opt level: O2

int * fekete_suborder(int rule,int suborder_num)

{
  int *piVar1;
  ostream *poVar2;
  long lVar3;
  undefined4 uVar4;
  ulong uVar5;
  long lStack_30;
  
  uVar5 = 0xffffffffffffffff;
  if (-1 < suborder_num) {
    uVar5 = (ulong)(uint)suborder_num << 2;
  }
  piVar1 = (int *)operator_new__(uVar5);
  switch(rule) {
  case 1:
    *piVar1 = 1;
    lVar3 = 8;
    uVar4 = 3;
    lStack_30 = 4;
    break;
  case 2:
    piVar1[0] = 1;
    piVar1[1] = 3;
    piVar1[2] = 3;
    piVar1[3] = 3;
    piVar1[4] = 6;
    lVar3 = 0x18;
    uVar4 = 6;
    lStack_30 = 0x14;
    break;
  case 3:
    piVar1[0] = 1;
    piVar1[1] = 3;
    piVar1[2] = 3;
    piVar1[3] = 3;
    piVar1[4] = 3;
    piVar1[5] = 6;
    piVar1[6] = 6;
    piVar1[7] = 6;
    piVar1[8] = 6;
    piVar1[9] = 6;
    lVar3 = 0x2c;
    uVar4 = 6;
    lStack_30 = 0x28;
    break;
  case 4:
    piVar1[0] = 1;
    piVar1[1] = 3;
    piVar1[2] = 3;
    piVar1[3] = 3;
    piVar1[4] = 3;
    piVar1[5] = 3;
    piVar1[6] = 3;
    piVar1[7] = 6;
    piVar1[8] = 6;
    piVar1[9] = 6;
    piVar1[10] = 6;
    piVar1[0xb] = 6;
    piVar1[0xc] = 6;
    piVar1[0xd] = 6;
    piVar1[0xe] = 6;
    piVar1[0xf] = 6;
    piVar1[0x10] = 6;
    lVar3 = 0x48;
    uVar4 = 6;
    lStack_30 = 0x44;
    break;
  case 5:
    piVar1[0] = 1;
    piVar1[1] = 3;
    piVar1[2] = 3;
    piVar1[3] = 3;
    piVar1[4] = 3;
    piVar1[5] = 3;
    piVar1[6] = 3;
    piVar1[7] = 3;
    piVar1[8] = 3;
    piVar1[9] = 3;
    piVar1[10] = 3;
    piVar1[0xb] = 6;
    piVar1[0xc] = 6;
    piVar1[0xd] = 6;
    piVar1[0xe] = 6;
    piVar1[0xf] = 6;
    piVar1[0x10] = 6;
    piVar1[0x11] = 6;
    piVar1[0x12] = 6;
    lVar3 = 0x50;
    uVar4 = 6;
    lStack_30 = 0x4c;
    break;
  case 6:
    piVar1[0] = 1;
    piVar1[1] = 3;
    piVar1[2] = 3;
    piVar1[3] = 3;
    piVar1[4] = 3;
    piVar1[5] = 3;
    piVar1[6] = 3;
    piVar1[7] = 3;
    piVar1[8] = 3;
    piVar1[9] = 3;
    piVar1[10] = 6;
    piVar1[0xb] = 6;
    piVar1[0xc] = 6;
    piVar1[0xd] = 6;
    piVar1[0xe] = 6;
    piVar1[0xf] = 6;
    piVar1[0x10] = 6;
    piVar1[0x11] = 6;
    piVar1[0x12] = 6;
    piVar1[0x13] = 6;
    piVar1[0x14] = 6;
    piVar1[0x15] = 6;
    piVar1[0x16] = 6;
    piVar1[0x17] = 6;
    piVar1[0x18] = 6;
    piVar1[0x19] = 6;
    lVar3 = 0x6c;
    uVar4 = 6;
    lStack_30 = 0x68;
    break;
  case 7:
    piVar1[0] = 1;
    piVar1[1] = 3;
    piVar1[2] = 3;
    piVar1[3] = 3;
    piVar1[4] = 3;
    piVar1[5] = 3;
    piVar1[6] = 3;
    piVar1[7] = 3;
    piVar1[8] = 3;
    piVar1[9] = 3;
    piVar1[10] = 3;
    piVar1[0xb] = 3;
    piVar1[0xc] = 6;
    piVar1[0xd] = 6;
    piVar1[0xe] = 6;
    piVar1[0xf] = 6;
    piVar1[0x10] = 6;
    piVar1[0x11] = 6;
    piVar1[0x12] = 6;
    piVar1[0x13] = 6;
    piVar1[0x14] = 6;
    piVar1[0x15] = 6;
    piVar1[0x16] = 6;
    piVar1[0x17] = 6;
    piVar1[0x18] = 6;
    piVar1[0x19] = 6;
    piVar1[0x1a] = 6;
    piVar1[0x1b] = 6;
    piVar1[0x1c] = 6;
    piVar1[0x1d] = 6;
    piVar1[0x1e] = 6;
    piVar1[0x1f] = 6;
    piVar1[0x20] = 6;
    piVar1[0x21] = 6;
    piVar1[0x22] = 6;
    piVar1[0x23] = 6;
    lVar3 = 0x94;
    uVar4 = 6;
    lStack_30 = 0x90;
    break;
  default:
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"FEKETE_SUBORDER - Fatal error!\n");
    poVar2 = std::operator<<((ostream *)&std::cerr,"  Illegal RULE = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,rule);
    std::operator<<(poVar2,"\n");
    exit(1);
  }
  *(undefined4 *)((long)piVar1 + lStack_30) = uVar4;
  *(undefined4 *)((long)piVar1 + lVar3) = 6;
  return piVar1;
}

Assistant:

int *fekete_suborder ( int rule, int suborder_num )

//****************************************************************************80
//
//  Purpose:
//
//    FEKETE_SUBORDER returns the suborders for a Fekete rule.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    02 October 2006
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Mark Taylor, Beth Wingate, Rachel Vincent,
//    An Algorithm for Computing Fekete Points in the Triangle,
//    SIAM Journal on Numerical Analysis,
//    Volume 38, Number 5, 2000, pages 1707-1720.
//
//  Parameters:
//
//    Input, int RULE, the index of the rule.
//
//    Input, int SUBORDER_NUM, the number of suborders of the rule.
//
//    Output, int FEKETE_SUBORDER[SUBORDER_NUM], the suborders of the rule.
//
{
  int *suborder;

  suborder = new int[suborder_num];

  if ( rule == 1 )
  {
    suborder[0] = 1;
    suborder[1] = 3;
    suborder[2] = 6;
  }
  else if ( rule == 2 )
  {
    suborder[0] = 1;
    suborder[1] = 3;
    suborder[2] = 3;
    suborder[3] = 3;
    suborder[4] = 6;
    suborder[5] = 6;
    suborder[6] = 6;
  }
  else if ( rule == 3 )
  {
    suborder[0] = 1;
    suborder[1] = 3;
    suborder[2] = 3;
    suborder[3] = 3;
    suborder[4] = 3;
    suborder[5] = 6;
    suborder[6] = 6;
    suborder[7] = 6;
    suborder[8] = 6;
    suborder[9] = 6;
    suborder[10] = 6;
    suborder[11] = 6;
  }
  else if ( rule == 4 )
  {
    suborder[0] = 1;
    suborder[1] = 3;
    suborder[2] = 3;
    suborder[3] = 3;
    suborder[4] = 3;
    suborder[5] = 3;
    suborder[6] = 3;
    suborder[7] = 6;
    suborder[8] = 6;
    suborder[9] = 6;
    suborder[10] = 6;
    suborder[11] = 6;
    suborder[12] = 6;
    suborder[13] = 6;
    suborder[14] = 6;
    suborder[15] = 6;
    suborder[16] = 6;
    suborder[17] = 6;
    suborder[18] = 6;
  }
  else if ( rule == 5 )
  {
    suborder[0] = 1;
    suborder[1] = 3;
    suborder[2] = 3;
    suborder[3] = 3;
    suborder[4] = 3;
    suborder[5] = 3;
    suborder[6] = 3;
    suborder[7] = 3;
    suborder[8] = 3;
    suborder[9] = 3;
    suborder[10] = 3;
    suborder[11] = 6;
    suborder[12] = 6;
    suborder[13] = 6;
    suborder[14] = 6;
    suborder[15] = 6;
    suborder[16] = 6;
    suborder[17] = 6;
    suborder[18] = 6;
    suborder[19] = 6;
    suborder[20] = 6;
  }
  else if ( rule == 6 )
  {
    suborder[0] = 1;
    suborder[1] = 3;
    suborder[2] = 3;
    suborder[3] = 3;
    suborder[4] = 3;
    suborder[5] = 3;
    suborder[6] = 3;
    suborder[7] = 3;
    suborder[8] = 3;
    suborder[9] = 3;
    suborder[10] = 6;
    suborder[11] = 6;
    suborder[12] = 6;
    suborder[13] = 6;
    suborder[14] = 6;
    suborder[15] = 6;
    suborder[16] = 6;
    suborder[17] = 6;
    suborder[18] = 6;
    suborder[19] = 6;
    suborder[20] = 6;
    suborder[21] = 6;
    suborder[22] = 6;
    suborder[23] = 6;
    suborder[24] = 6;
    suborder[25] = 6;
    suborder[26] = 6;
    suborder[27] = 6;
  }
  else if ( rule == 7 )
  {
    suborder[0] = 1;
    suborder[1] = 3;
    suborder[2] = 3;
    suborder[3] = 3;
    suborder[4] = 3;
    suborder[5] = 3;
    suborder[6] = 3;
    suborder[7] = 3;
    suborder[8] = 3;
    suborder[9] = 3;
    suborder[10] = 3;
    suborder[11] = 3;
    suborder[12] = 6;
    suborder[13] = 6;
    suborder[14] = 6;
    suborder[15] = 6;
    suborder[16] = 6;
    suborder[17] = 6;
    suborder[18] = 6;
    suborder[19] = 6;
    suborder[20] = 6;
    suborder[21] = 6;
    suborder[22] = 6;
    suborder[23] = 6;
    suborder[24] = 6;
    suborder[25] = 6;
    suborder[26] = 6;
    suborder[27] = 6;
    suborder[28] = 6;
    suborder[29] = 6;
    suborder[30] = 6;
    suborder[31] = 6;
    suborder[32] = 6;
    suborder[33] = 6;
    suborder[34] = 6;
    suborder[35] = 6;
    suborder[36] = 6;
    suborder[37] = 6;
  }
  else
  {
    std::cerr << "\n";
    std::cerr << "FEKETE_SUBORDER - Fatal error!\n";
    std::cerr << "  Illegal RULE = " << rule << "\n";
    exit ( 1 );
  }

  return suborder;
}